

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBox::setText(QMessageBox *this,QString *text)

{
  long lVar1;
  TextFormat TVar2;
  QMessageBoxPrivate *this_00;
  QString *in_RSI;
  QLabel *in_RDI;
  long in_FS_OFFSET;
  QMessageBoxPrivate *d;
  undefined1 in_stack_ffffffffffffffbf;
  QLabel *this_01;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar3;
  QMessageBoxPrivate *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QMessageBox *)0x7a39ca);
  QLabel::setText(in_RDI,in_RSI);
  this_01 = this_00->label;
  TVar2 = QLabel::textFormat(this_01);
  uVar3 = 1;
  if (TVar2 != RichText) {
    TVar2 = QLabel::textFormat(this_01);
    in_stack_ffffffffffffffbf = false;
    if (TVar2 == AutoText) {
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)this_00,(QString *)CONCAT17(uVar3,in_stack_ffffffffffffffc8));
      in_stack_ffffffffffffffbf = Qt::mightBeRichText((QAnyStringView *)in_stack_ffffffffffffffe8);
    }
  }
  QLabel::setWordWrap(this_01,(bool)in_stack_ffffffffffffffbf);
  QMessageBoxPrivate::updateSize(in_stack_ffffffffffffffe8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMessageBox::setText(const QString &text)
{
    Q_D(QMessageBox);
    d->label->setText(text);
    d->label->setWordWrap(d->label->textFormat() == Qt::RichText
        || (d->label->textFormat() == Qt::AutoText && Qt::mightBeRichText(text)));
    d->updateSize();
}